

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *path;
  int iVar1;
  int *piVar2;
  mapped_type *pmVar3;
  bool bVar4;
  allocator local_20e9;
  string local_20e8 [55];
  allocator local_20b1;
  string local_20b0 [32];
  undefined1 local_2090 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  char *rom_ext;
  char *rom_path;
  int num_error;
  int argnum;
  int argi;
  char *psfby;
  char libname [4096];
  char snsf_path [4096];
  uint32_t local_2c;
  char *pcStack_28;
  uint32_t load_offset;
  char *endptr;
  long longval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  longval = (long)argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    usage(*argv);
    return 1;
  }
  pcStack_28 = (char *)0x0;
  local_2c = 0;
  memset(libname + 0xff8,0,0x1000);
  memset(&psfby,0,0x1000);
  _argnum = (char *)0x0;
  num_error = 1;
  do {
    bVar4 = false;
    if (num_error < (int)argv_local) {
      bVar4 = **(char **)(longval + (long)num_error * 8) == '-';
    }
    if (!bVar4) {
      if ((int)argv_local == num_error) {
        fprintf(_stderr,"Error: Too few arguments\n");
        return 1;
      }
      if ((1 < (int)argv_local - num_error) && (iVar1 = strcmp(libname + 0xff8,""), iVar1 != 0)) {
        fprintf(_stderr,"Error: Unable to specify output filename for multiple inputs\n");
        return 1;
      }
      rom_path._4_4_ = 0;
      for (; num_error < (int)argv_local; num_error = num_error + 1) {
        path = *(char **)(longval + (long)num_error * 8);
        tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)path_findext(path);
        iVar1 = strcmp(libname + 0xff8,"");
        if (iVar1 == 0) {
          strcpy(libname + 0xff8,path);
          path_stripext(libname + 0xff8);
          iVar1 = strcmp((char *)&psfby,"");
          if (iVar1 == 0) {
            strcat(libname + 0xff8,".snsf");
          }
          else {
            strcat(libname + 0xff8,".minisnsf");
          }
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2090);
        iVar1 = strcmp((char *)&psfby,"");
        if (iVar1 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_20b0,"_lib",&local_20b1);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2090,(key_type *)local_20b0);
          std::__cxx11::string::operator=((string *)pmVar3,(char *)&psfby);
          std::__cxx11::string::~string(local_20b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_20b1);
        }
        if ((_argnum != (char *)0x0) && (iVar1 = strcmp(_argnum,""), iVar1 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_20e8,"snsfby",&local_20e9);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_2090,(key_type *)local_20e8);
          std::__cxx11::string::operator=((string *)pmVar3,_argnum);
          std::__cxx11::string::~string(local_20e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_20e9);
        }
        bVar4 = rom2snsf(path,libname + 0xff8,local_2c,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_2090);
        if (!bVar4) {
          rom_path._4_4_ = rom_path._4_4_ + 1;
        }
        puts(libname + 0xff8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2090);
      }
      if (rom_path._4_4_ != 0) {
        fprintf(_stderr,"%d error(s)\n",(ulong)rom_path._4_4_);
      }
      return (uint)(rom_path._4_4_ != 0);
    }
    iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"--help");
    if (iVar1 == 0) {
      usage(*(char **)longval);
      return 1;
    }
    iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"-o");
    if (iVar1 == 0) {
      if ((int)argv_local <= num_error + 1) {
        fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                *(undefined8 *)(longval + (long)num_error * 8));
        return 1;
      }
      strcpy(libname + 0xff8,*(char **)(longval + (long)(num_error + 1) * 8));
    }
    else {
      iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"--load");
      if (iVar1 == 0) {
        if ((int)argv_local <= num_error + 1) {
          fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                  *(undefined8 *)(longval + (long)num_error * 8));
          return 1;
        }
        endptr = (char *)strtol(*(char **)(longval + (long)(num_error + 1) * 8),
                                &stack0xffffffffffffffd8,0x10);
        if (((*pcStack_28 != '\0') || (piVar2 = __errno_location(), *piVar2 == 0x22)) ||
           ((long)endptr < 0)) {
          fprintf(_stderr,"Error: Number format error \"%s\"\n",
                  *(undefined8 *)(longval + (long)(num_error + 1) * 8));
          return 1;
        }
        local_2c = (uint32_t)endptr;
        if (0x7fffff < local_2c) {
          fprintf(_stderr,"Error: Load offset too large 0x%08X\n",(ulong)endptr & 0xffffffff);
          return 1;
        }
      }
      else {
        iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"--lib");
        if (iVar1 == 0) {
          if ((int)argv_local <= num_error + 1) {
            fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                    *(undefined8 *)(longval + (long)num_error * 8));
            return 1;
          }
          strcpy((char *)&psfby,*(char **)(longval + (long)(num_error + 1) * 8));
        }
        else {
          iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"--psfby");
          if ((iVar1 != 0) &&
             (iVar1 = strcmp(*(char **)(longval + (long)num_error * 8),"--snsfby"), iVar1 != 0)) {
            fprintf(_stderr,"Error: Unknown option \"%s\"\n",
                    *(undefined8 *)(longval + (long)num_error * 8));
            return 1;
          }
          if ((int)argv_local <= num_error + 1) {
            fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                    *(undefined8 *)(longval + (long)num_error * 8));
            return 1;
          }
          _argnum = *(char **)(longval + (long)(num_error + 1) * 8);
        }
      }
    }
    num_error = num_error + 2;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	uint32_t load_offset = 0;
	char snsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(snsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;

			if (load_offset >= SNES_ROM_MAX_SIZE) {
				fprintf(stderr, "Error: Load offset too large 0x%08X\n", load_offset);
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: Too few arguments\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(snsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(snsf_path, "") == 0) {
			strcpy(snsf_path, rom_path);
			path_stripext(snsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(snsf_path, ".minisnsf");
			}
			else {
				strcat(snsf_path, ".snsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		if (!rom2snsf(rom_path, snsf_path, load_offset, tags)) {
			num_error++;
		}

		puts(snsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}